

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O0

int count_bytes(uint32_t integer)

{
  int bytes;
  uint32_t integer_local;
  
  bytes = 0;
  for (integer_local = integer; integer_local != 0; integer_local = integer_local >> 8) {
    bytes = bytes + 1;
  }
  return bytes;
}

Assistant:

int count_bytes(uint32_t integer) {
    int bytes = 0;
    while (integer > 0) {
        integer >>= 8;
        bytes++;
    }
    return bytes;
}